

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmIllegal<(moira::Instr)185,(moira::Mode)8,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  Syntax SVar1;
  StrWriter *pSVar2;
  UInt16 local_32;
  int local_30;
  UInt16 local_2a;
  Int local_28;
  ushort local_22;
  u32 *puStack_20;
  u16 op_local;
  u32 *addr_local;
  StrWriter *str_local;
  Moira *this_local;
  
  SVar1 = str->style->syntax;
  local_22 = op;
  puStack_20 = addr;
  addr_local = (u32 *)str;
  str_local = (StrWriter *)this;
  if (SVar1 - GNU < 2) {
    pSVar2 = StrWriter::operator<<(str,".short ");
    Int::Int(&local_28,(uint)local_22);
    StrWriter::operator<<(pSVar2,local_28);
  }
  else if (SVar1 == MUSASHI) {
    pSVar2 = StrWriter::operator<<(str,"dc.w ");
    UInt16::UInt16(&local_2a,local_22);
    pSVar2 = StrWriter::operator<<(pSVar2,local_2a);
    StrWriter::operator<<(pSVar2,"; ILLEGAL");
  }
  else {
    pSVar2 = StrWriter::operator<<(str,"dc.w ");
    local_30 = addr_local[0xe];
    pSVar2 = StrWriter::operator<<(pSVar2,(Tab)local_30);
    UInt16::UInt16(&local_32,local_22);
    pSVar2 = StrWriter::operator<<(pSVar2,local_32);
    StrWriter::operator<<(pSVar2,"; ILLEGAL");
  }
  return;
}

Assistant:

void
Moira::dasmIllegal(StrWriter &str, u32 &addr, u16 op) const
{
    switch (str.style.syntax) {

       case Syntax::GNU:
        case Syntax::GNU_MIT:

            str << ".short " << Int{op};
            break;

        case Syntax::MUSASHI:

            str << "dc.w " << UInt16{op} << "; ILLEGAL";
            break;

        default:

            str << "dc.w " << str.tab << UInt16{op} << "; ILLEGAL";
            break;
    }
}